

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O3

void Pdr_SetPrint(FILE *pFile,Pdr_Set_t *p,int nRegs,Vec_Int_t *vFlopCounts)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  char *__s;
  ulong uVar4;
  long lVar5;
  
  __s = (char *)malloc((long)(nRegs + 1));
  if (nRegs < 1) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)(uint)nRegs;
    memset(__s,0x2d,uVar4);
  }
  __s[uVar4] = '\0';
  iVar1 = p->nLits;
  if (0 < (long)iVar1) {
    lVar5 = 0;
    do {
      iVar3 = *(int *)(&p->field_0x14 + lVar5 * 4);
      if (iVar3 != -1) {
        __s[iVar3 >> 1] = (byte)iVar3 & 1 ^ 0x31;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  if (vFlopCounts == (Vec_Int_t *)0x0) {
    fputs(__s,(FILE *)pFile);
    if (__s == (char *)0x0) {
      return;
    }
  }
  else {
    iVar1 = vFlopCounts->nSize;
    uVar4 = 0;
    if (0 < (long)iVar1) {
      piVar2 = vFlopCounts->pArray;
      lVar5 = 0;
      do {
        if (piVar2[lVar5] != 0) {
          iVar3 = (int)uVar4;
          uVar4 = (ulong)(iVar3 + 1);
          __s[iVar3] = __s[lVar5];
        }
        lVar5 = lVar5 + 1;
      } while (iVar1 != lVar5);
      uVar4 = (ulong)(int)uVar4;
    }
    __s[uVar4] = '\0';
    fputs(__s,(FILE *)pFile);
  }
  free(__s);
  return;
}

Assistant:

void Pdr_SetPrint( FILE * pFile, Pdr_Set_t * p, int nRegs, Vec_Int_t * vFlopCounts )
{
    char * pBuff;
    int i, k, Entry;
    pBuff = ABC_ALLOC( char, nRegs + 1 );
    for ( i = 0; i < nRegs; i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        if ( p->Lits[i] == -1 )
            continue;
        pBuff[lit_var(p->Lits[i])] = (lit_sign(p->Lits[i])? '0':'1');
    }
    if ( vFlopCounts )
    {
        // skip some literals
        k = 0;
        Vec_IntForEachEntry( vFlopCounts, Entry, i )
            if ( Entry ) 
                pBuff[k++] = pBuff[i];
        pBuff[k] = 0;
    }
    fprintf( pFile, "%s", pBuff );
    ABC_FREE( pBuff );
}